

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_global.c
# Opt level: O0

int collectionEach(mpt_collection *c,mpt_item_handler_t *handler,void *ctx)

{
  int iVar1;
  mpt_collection mStack_50;
  int ret;
  _node_collection col_1;
  _mpt_vptr_collection cvptr;
  mpt_node *n;
  _node_collection *col;
  void *ctx_local;
  mpt_item_handler_t *handler_local;
  mpt_collection *c_local;
  
  col_1.n = (mpt_node *)collectionEach;
  cvptr.each = (_func_int_mpt_collection_ptr_mpt_item_handler_t_ptr_void_ptr *)c[1]._vptr;
  if ((_mpt_vptr_collection *)cvptr.each != (_mpt_vptr_collection *)0x0) {
    for (; cvptr.each != (_func_int_mpt_collection_ptr_mpt_item_handler_t_ptr_void_ptr *)0x0;
        cvptr.each = cvptr.each[8]) {
      mStack_50._vptr = (_mpt_vptr_collection *)&col_1.n;
      col_1.col._vptr = *(_mpt_vptr_collection **)(cvptr.each + 0x20);
      iVar1 = (*handler)(ctx,(mpt_identifier *)(cvptr.each + 0x28),*(mpt_convertable **)cvptr.each,
                         &stack0xffffffffffffffb0);
      if (iVar1 < 0) {
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

static int collectionEach(const MPT_INTERFACE(collection) *c, MPT_TYPE(item_handler) handler, void *ctx)
{
	struct _node_collection *col = (void *) c;
	MPT_STRUCT(node) *n;
	const MPT_INTERFACE_VPTR(collection) cvptr = { collectionEach };
	
	if (!(n = col->n)) {
		return 0;
	}
	while (n) {
		struct _node_collection col = { { &cvptr }, n->children };
		int ret = handler(ctx, &n->ident, (MPT_INTERFACE(convertable) *) n->_meta, &col.col);
		if (ret < 0) {
			return ret;
		}
		n = n->next;
	}
	return 0;
}